

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_GeometryFingerprint::Matches
          (ON_GeometryFingerprint *this,ON_GeometryFingerprint *b,ON_Xform *bt,double tol)

{
  bool bVar1;
  
  if (this->m_topologyCRC == b->m_topologyCRC) {
    bVar1 = ON_WeightedAverageHash::Matches(&this->m_pointWAH,&b->m_pointWAH,bt,tol);
    if (bVar1) {
      bVar1 = ON_WeightedAverageHash::Matches(&this->m_edgeWAH,&b->m_edgeWAH,bt,tol);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_GeometryFingerprint::Matches(const ON_GeometryFingerprint& b, const ON_Xform& bt, double tol) const
{
  if (m_topologyCRC != b.m_topologyCRC)
    return false;
  if (!m_pointWAH.Matches(b.m_pointWAH, bt, tol))
    return false;
  if (!m_edgeWAH.Matches(b.m_edgeWAH, bt, tol))
    return false;
  return true;
}